

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

int Imf_2_5::anon_unknown_12::ceilLog2(int x)

{
  int r;
  int y;
  int x_local;
  
  y = 0;
  r = 0;
  for (x_local = x; 1 < x_local; x_local = x_local >> 1) {
    if ((x_local & 1U) != 0) {
      r = 1;
    }
    y = y + 1;
  }
  return y + r;
}

Assistant:

int
ceilLog2 (int x)
{
    //
    // For x > 0, ceilLog2(y) returns ceil(log(x)/log(2)).
    //

    int y = 0;
    int r = 0;

    while (x > 1)
    {
	if (x & 1)
	    r = 1;

	y +=  1;
	x >>= 1;
    }

    return y + r;
}